

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_init_internal(ma_decoding_backend_config *pConfig,ma_wav *pWav)

{
  ma_data_source_config pDataSource;
  void *in_RSI;
  int *in_RDI;
  ma_data_source_config dataSourceConfig;
  ma_result result;
  ma_result local_14;
  
  if (in_RSI == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI != (void *)0x0) {
      memset(in_RSI,0,0x200);
    }
    *(undefined4 *)((long)in_RSI + 0x68) = 0;
    if ((in_RDI != (int *)0x0) && (((*in_RDI == 5 || (*in_RDI == 2)) || (*in_RDI == 4)))) {
      *(int *)((long)in_RSI + 0x68) = *in_RDI;
    }
    pDataSource = ma_data_source_config_init();
    local_14 = ma_data_source_init((ma_data_source_config *)&g_ma_wav_ds_vtable,pDataSource.vtable);
    if (local_14 == MA_SUCCESS) {
      local_14 = MA_SUCCESS;
    }
  }
  return local_14;
}

Assistant:

static ma_result ma_wav_init_internal(const ma_decoding_backend_config* pConfig, ma_wav* pWav)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pWav);
    pWav->format = ma_format_unknown;   /* Use closest match to source file by default. */

    if (pConfig != NULL && (pConfig->preferredFormat == ma_format_f32 || pConfig->preferredFormat == ma_format_s16 || pConfig->preferredFormat == ma_format_s32)) {
        pWav->format = pConfig->preferredFormat;
    } else {
        /* Getting here means something other than f32 and s16 was specified. Just leave this unset to use the default format. */
    }

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_wav_ds_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pWav->ds);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the base data source. */
    }

    return MA_SUCCESS;
}